

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O0

int create_openssl_instance(TLS_IO_INSTANCE *tlsInstance)

{
  int iVar1;
  SSL_METHOD *meth;
  SSL_CTX *pSVar2;
  BIO_METHOD *pBVar3;
  BIO *pBVar4;
  long lVar5;
  LOGGER_LOG p_Var6;
  SSL *pSVar7;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  SSL_METHOD *method;
  int result;
  TLS_IO_INSTANCE *tlsInstance_local;
  
  meth = (SSL_METHOD *)TLS_method();
  pSVar2 = SSL_CTX_new(meth);
  tlsInstance->ssl_context = (SSL_CTX *)pSVar2;
  if (tlsInstance->ssl_context == (SSL_CTX *)0x0) {
    log_ERR_get_error("Failed allocating OpenSSL context.");
    method._4_4_ = 0x440;
  }
  else if ((tlsInstance->engine_id == (char *)0x0) || (iVar1 = engine_load(tlsInstance), iVar1 == 0)
          ) {
    if ((tlsInstance->cipher_list == (char *)0x0) ||
       (iVar1 = SSL_CTX_set_cipher_list
                          ((SSL_CTX *)tlsInstance->ssl_context,tlsInstance->cipher_list), iVar1 == 1
       )) {
      iVar1 = add_certificate_to_store(tlsInstance,tlsInstance->certificate);
      if (iVar1 == 0) {
        if (((tlsInstance->x509_certificate == (char *)0x0) ||
            (tlsInstance->x509_private_key == (char *)0x0)) ||
           (iVar1 = x509_openssl_add_credentials
                              (tlsInstance->ssl_context,tlsInstance->x509_certificate,
                               tlsInstance->x509_private_key,tlsInstance->x509_private_key_type,
                               tlsInstance->engine), iVar1 == 0)) {
          SSL_CTX_set_cert_verify_callback
                    ((SSL_CTX *)tlsInstance->ssl_context,(cb *)tlsInstance->tls_validation_callback,
                     tlsInstance->tls_validation_callback_data);
          pBVar3 = BIO_s_mem();
          pBVar4 = BIO_new(pBVar3);
          tlsInstance->in_bio = (BIO *)pBVar4;
          if (tlsInstance->in_bio == (BIO *)0x0) {
            engine_destroy(tlsInstance);
            SSL_CTX_free((SSL_CTX *)tlsInstance->ssl_context);
            tlsInstance->ssl_context = (SSL_CTX *)0x0;
            log_ERR_get_error("Failed BIO_new for in BIO.");
            method._4_4_ = 0x47d;
          }
          else {
            pBVar3 = BIO_s_mem();
            pBVar4 = BIO_new(pBVar3);
            tlsInstance->out_bio = (BIO *)pBVar4;
            if (tlsInstance->out_bio == (BIO *)0x0) {
              BIO_free((BIO *)tlsInstance->in_bio);
              engine_destroy(tlsInstance);
              SSL_CTX_free((SSL_CTX *)tlsInstance->ssl_context);
              tlsInstance->ssl_context = (SSL_CTX *)0x0;
              log_ERR_get_error("Failed BIO_new for out BIO.");
              method._4_4_ = 0x489;
            }
            else {
              lVar5 = BIO_ctrl((BIO *)tlsInstance->in_bio,0x82,-1,(void *)0x0);
              if ((lVar5 < 1) ||
                 (lVar5 = BIO_ctrl((BIO *)tlsInstance->out_bio,0x82,-1,(void *)0x0), lVar5 < 1)) {
                BIO_free((BIO *)tlsInstance->in_bio);
                BIO_free((BIO *)tlsInstance->out_bio);
                engine_destroy(tlsInstance);
                SSL_CTX_free((SSL_CTX *)tlsInstance->ssl_context);
                tlsInstance->ssl_context = (SSL_CTX *)0x0;
                p_Var6 = xlogging_get_log_function();
                if (p_Var6 != (LOGGER_LOG)0x0) {
                  (*p_Var6)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/tlsio_openssl.c"
                            ,"create_openssl_instance",0x495,1,"Failed BIO_set_mem_eof_return.");
                }
                method._4_4_ = 0x496;
              }
              else {
                SSL_CTX_set_verify((SSL_CTX *)tlsInstance->ssl_context,1,(callback *)0x0);
                iVar1 = SSL_CTX_set_default_verify_paths((SSL_CTX *)tlsInstance->ssl_context);
                if ((iVar1 != 1) &&
                   (p_Var6 = xlogging_get_log_function(), p_Var6 != (LOGGER_LOG)0x0)) {
                  (*p_Var6)(AZ_LOG_INFO,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/tlsio_openssl.c"
                            ,"create_openssl_instance",0x4a0,1,
                            "WARNING: Unable to specify the default location for CA certificates on this platform."
                           );
                }
                pSVar7 = SSL_new((SSL_CTX *)tlsInstance->ssl_context);
                tlsInstance->ssl = (SSL *)pSVar7;
                if (tlsInstance->ssl == (SSL *)0x0) {
                  BIO_free((BIO *)tlsInstance->in_bio);
                  BIO_free((BIO *)tlsInstance->out_bio);
                  engine_destroy(tlsInstance);
                  SSL_CTX_free((SSL_CTX *)tlsInstance->ssl_context);
                  tlsInstance->ssl_context = (SSL_CTX *)0x0;
                  log_ERR_get_error("Failed creating OpenSSL instance.");
                  method._4_4_ = 0x4ad;
                }
                else {
                  lVar5 = SSL_ctrl((SSL *)tlsInstance->ssl,0x37,0,tlsInstance->hostname);
                  if (lVar5 == 1) {
                    iVar1 = enable_domain_check(tlsInstance);
                    if (iVar1 == 0) {
                      SSL_set_bio((SSL *)tlsInstance->ssl,(BIO *)tlsInstance->in_bio,
                                  (BIO *)tlsInstance->out_bio);
                      SSL_set_connect_state((SSL *)tlsInstance->ssl);
                      method._4_4_ = 0;
                    }
                    else {
                      SSL_free((SSL *)tlsInstance->ssl);
                      tlsInstance->ssl = (SSL *)0x0;
                      BIO_free((BIO *)tlsInstance->in_bio);
                      BIO_free((BIO *)tlsInstance->out_bio);
                      SSL_CTX_free((SSL_CTX *)tlsInstance->ssl_context);
                      tlsInstance->ssl_context = (SSL_CTX *)0x0;
                      log_ERR_get_error("Failed to configure domain name verification.");
                      method._4_4_ = 0x4c4;
                    }
                  }
                  else {
                    SSL_free((SSL *)tlsInstance->ssl);
                    tlsInstance->ssl = (SSL *)0x0;
                    BIO_free((BIO *)tlsInstance->in_bio);
                    BIO_free((BIO *)tlsInstance->out_bio);
                    engine_destroy(tlsInstance);
                    SSL_CTX_free((SSL_CTX *)tlsInstance->ssl_context);
                    tlsInstance->ssl_context = (SSL_CTX *)0x0;
                    log_ERR_get_error("Failed setting SNI hostname hint.");
                    method._4_4_ = 0x4b9;
                  }
                }
              }
            }
          }
        }
        else {
          engine_destroy(tlsInstance);
          SSL_CTX_free((SSL_CTX *)tlsInstance->ssl_context);
          tlsInstance->ssl_context = (SSL_CTX *)0x0;
          log_ERR_get_error("unable to use x509 authentication");
          method._4_4_ = 0x470;
        }
      }
      else {
        engine_destroy(tlsInstance);
        SSL_CTX_free((SSL_CTX *)tlsInstance->ssl_context);
        tlsInstance->ssl_context = (SSL_CTX *)0x0;
        log_ERR_get_error("unable to add_certificate_to_store.");
        method._4_4_ = 0x45a;
      }
    }
    else {
      engine_destroy(tlsInstance);
      SSL_CTX_free((SSL_CTX *)tlsInstance->ssl_context);
      tlsInstance->ssl_context = (SSL_CTX *)0x0;
      log_ERR_get_error("unable to set cipher list.");
      method._4_4_ = 0x452;
    }
  }
  else {
    SSL_CTX_free((SSL_CTX *)tlsInstance->ssl_context);
    tlsInstance->ssl_context = (SSL_CTX *)0x0;
    method._4_4_ = 0x448;
  }
  return method._4_4_;
}

Assistant:

static int create_openssl_instance(TLS_IO_INSTANCE* tlsInstance)
{
    int result;

    const SSL_METHOD* method = NULL;

#if (OPENSSL_VERSION_NUMBER < 0x10100000L) || defined(LIBRESSL_VERSION_NUMBER)
    if (tlsInstance->tls_version == VERSION_1_2)
    {
        method = TLSv1_2_method();
    }
    else if (tlsInstance->tls_version == VERSION_1_1)
    {
        method = TLSv1_1_method();
    }
    else
    {
        method = TLSv1_method();
    }
#else
    {
        method = TLS_method();
    }
#endif

    tlsInstance->ssl_context = SSL_CTX_new(method);
    if (tlsInstance->ssl_context == NULL)
    {
        log_ERR_get_error("Failed allocating OpenSSL context.");
        result = MU_FAILURE;
    }
    #ifndef OPENSSL_NO_ENGINE
    else if ((tlsInstance->engine_id != NULL) &&
             (engine_load(tlsInstance) != 0))
    {
        SSL_CTX_free(tlsInstance->ssl_context);
        tlsInstance->ssl_context = NULL;
        result = MU_FAILURE;
    }
    #endif // OPENSSL_NO_ENGINE
    else if ((tlsInstance->cipher_list != NULL) &&
             (SSL_CTX_set_cipher_list(tlsInstance->ssl_context, tlsInstance->cipher_list)) != 1)
    {
        engine_destroy(tlsInstance);
        SSL_CTX_free(tlsInstance->ssl_context);
        tlsInstance->ssl_context = NULL;
        log_ERR_get_error("unable to set cipher list.");
        result = MU_FAILURE;
    }
    else if (add_certificate_to_store(tlsInstance, tlsInstance->certificate) != 0)
    {
        engine_destroy(tlsInstance);
        SSL_CTX_free(tlsInstance->ssl_context);
        tlsInstance->ssl_context = NULL;
        log_ERR_get_error("unable to add_certificate_to_store.");
        result = MU_FAILURE;
    }
    /*x509 authentication can only be build before underlying connection is realized*/
    else if (
        (tlsInstance->x509_certificate != NULL) &&
        (tlsInstance->x509_private_key != NULL) &&
        (x509_openssl_add_credentials(
            tlsInstance->ssl_context, 
            tlsInstance->x509_certificate, 
            tlsInstance->x509_private_key,
    #ifndef OPENSSL_NO_ENGINE
            tlsInstance->x509_private_key_type,
            tlsInstance->engine) != 0)
    #else // OPENSSL_NO_ENGINE
            tlsInstance->x509_private_key_type) != 0)
    #endif // OPENSSL_NO_ENGINE
        )
    {
        engine_destroy(tlsInstance);
        SSL_CTX_free(tlsInstance->ssl_context);
        tlsInstance->ssl_context = NULL;
        log_ERR_get_error("unable to use x509 authentication");
        result = MU_FAILURE;
    }
    else
    {
        SSL_CTX_set_cert_verify_callback(tlsInstance->ssl_context, tlsInstance->tls_validation_callback, tlsInstance->tls_validation_callback_data);

        tlsInstance->in_bio = BIO_new(BIO_s_mem());
        if (tlsInstance->in_bio == NULL)
        {
            engine_destroy(tlsInstance);
            SSL_CTX_free(tlsInstance->ssl_context);
            tlsInstance->ssl_context = NULL;
            log_ERR_get_error("Failed BIO_new for in BIO.");
            result = MU_FAILURE;
        }
        else
        {
            tlsInstance->out_bio = BIO_new(BIO_s_mem());
            if (tlsInstance->out_bio == NULL)
            {
                (void)BIO_free(tlsInstance->in_bio);
                engine_destroy(tlsInstance);
                SSL_CTX_free(tlsInstance->ssl_context);
                tlsInstance->ssl_context = NULL;
                log_ERR_get_error("Failed BIO_new for out BIO.");
                result = MU_FAILURE;
            }
            else
            {
                if ((BIO_set_mem_eof_return(tlsInstance->in_bio, -1) <= 0) ||
                    (BIO_set_mem_eof_return(tlsInstance->out_bio, -1) <= 0))
                {
                    (void)BIO_free(tlsInstance->in_bio);
                    (void)BIO_free(tlsInstance->out_bio);
                    engine_destroy(tlsInstance);
                    SSL_CTX_free(tlsInstance->ssl_context);
                    tlsInstance->ssl_context = NULL;
                    LogError("Failed BIO_set_mem_eof_return.");
                    result = MU_FAILURE;
                }
                else
                {
                    SSL_CTX_set_verify(tlsInstance->ssl_context, SSL_VERIFY_PEER, NULL);

                    // Specifies that the default locations for which CA certificates are loaded should be used.
                    if (SSL_CTX_set_default_verify_paths(tlsInstance->ssl_context) != 1)
                    {
                        // This is only a warning to the user. They can still specify the certificate via SetOption.
                        LogInfo("WARNING: Unable to specify the default location for CA certificates on this platform.");
                    }

                    tlsInstance->ssl = SSL_new(tlsInstance->ssl_context);

                    if (tlsInstance->ssl == NULL)
                    {
                        (void)BIO_free(tlsInstance->in_bio);
                        (void)BIO_free(tlsInstance->out_bio);
                        engine_destroy(tlsInstance);
                        SSL_CTX_free(tlsInstance->ssl_context);
                        tlsInstance->ssl_context = NULL;
                        log_ERR_get_error("Failed creating OpenSSL instance.");
                        result = MU_FAILURE;
                    }
                    else if (SSL_set_tlsext_host_name(tlsInstance->ssl, tlsInstance->hostname) != 1)
                    {
                        SSL_free(tlsInstance->ssl);
                        tlsInstance->ssl = NULL;
                        (void)BIO_free(tlsInstance->in_bio);
                        (void)BIO_free(tlsInstance->out_bio);
                        engine_destroy(tlsInstance);
                        SSL_CTX_free(tlsInstance->ssl_context);
                        tlsInstance->ssl_context = NULL;
                        log_ERR_get_error("Failed setting SNI hostname hint.");
                        result = MU_FAILURE;
                    }
                    else if (enable_domain_check(tlsInstance))
                    {
                        SSL_free(tlsInstance->ssl);
                        tlsInstance->ssl = NULL;
                        (void)BIO_free(tlsInstance->in_bio);
                        (void)BIO_free(tlsInstance->out_bio);
                        SSL_CTX_free(tlsInstance->ssl_context);
                        tlsInstance->ssl_context = NULL;
                        log_ERR_get_error("Failed to configure domain name verification.");
                        result = MU_FAILURE;
                    }
                    else
                    {
                        SSL_set_bio(tlsInstance->ssl, tlsInstance->in_bio, tlsInstance->out_bio);
                        SSL_set_connect_state(tlsInstance->ssl);
                        result = 0;
                    }
                }
            }
        }
    }
    return result;
}